

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackExternalGenerator.cxx
# Opt level: O3

int __thiscall cmCPackExternalGenerator::InitializeInternal(cmCPackExternalGenerator *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmCPackExternalVersionGenerator *pcVar2;
  cmCPackLog *this_00;
  _Alloc_hider msg;
  bool bVar3;
  int iVar4;
  char *__s;
  cmCPackExternalVersionGenerator *pcVar5;
  size_t length;
  string major;
  allocator<char> local_1b1;
  string local_1b0;
  string local_190 [3];
  ios_base local_120 [264];
  
  paVar1 = &local_190[0].field_2;
  local_190[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_190,"CPACK_EXTERNAL_KNOWN_VERSIONS","");
  cmCPackGenerator::SetOption(&this->super_cmCPackGenerator,local_190,"1.0");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_190[0]._M_dataplus._M_p,local_190[0].field_2._M_allocated_capacity + 1);
  }
  bVar3 = cmCPackGenerator::ReadListFile
                    (&this->super_cmCPackGenerator,"Internal/CPack/CPackExternal.cmake");
  if (bVar3) {
    local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1b0,"CPACK_EXTERNAL_SELECTED_MAJOR","");
    __s = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_1b0);
    std::__cxx11::string::string<std::allocator<char>>((string *)local_190,__s,&local_1b1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
      operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
    }
    iVar4 = std::__cxx11::string::compare((char *)local_190);
    if (iVar4 == 0) {
      pcVar5 = (cmCPackExternalVersionGenerator *)operator_new(0x10);
      pcVar5->Parent = this;
      pcVar5->_vptr_cmCPackExternalVersionGenerator =
           (_func_int **)&PTR__cmCPackExternalVersionGenerator_00622600;
      pcVar2 = (this->Generator)._M_t.
               super___uniq_ptr_impl<cmCPackExternalGenerator::cmCPackExternalVersionGenerator,_std::default_delete<cmCPackExternalGenerator::cmCPackExternalVersionGenerator>_>
               ._M_t.
               super__Tuple_impl<0UL,_cmCPackExternalGenerator::cmCPackExternalVersionGenerator_*,_std::default_delete<cmCPackExternalGenerator::cmCPackExternalVersionGenerator>_>
               .
               super__Head_base<0UL,_cmCPackExternalGenerator::cmCPackExternalVersionGenerator_*,_false>
               ._M_head_impl;
      (this->Generator)._M_t.
      super___uniq_ptr_impl<cmCPackExternalGenerator::cmCPackExternalVersionGenerator,_std::default_delete<cmCPackExternalGenerator::cmCPackExternalVersionGenerator>_>
      ._M_t.
      super__Tuple_impl<0UL,_cmCPackExternalGenerator::cmCPackExternalVersionGenerator_*,_std::default_delete<cmCPackExternalGenerator::cmCPackExternalVersionGenerator>_>
      .super__Head_base<0UL,_cmCPackExternalGenerator::cmCPackExternalVersionGenerator_*,_false>.
      _M_head_impl = pcVar5;
      if (pcVar2 != (cmCPackExternalVersionGenerator *)0x0) {
        (*pcVar2->_vptr_cmCPackExternalVersionGenerator[1])();
      }
    }
    iVar4 = cmCPackGenerator::InitializeInternal(&this->super_cmCPackGenerator);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190[0]._M_dataplus._M_p != paVar1) {
      operator_delete(local_190[0]._M_dataplus._M_p,local_190[0].field_2._M_allocated_capacity + 1);
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,"Error while executing CPackExternal.cmake",0x29);
    std::ios::widen((char)local_190 + (char)*(undefined8 *)(local_190[0]._M_dataplus._M_p + -0x18));
    std::ostream::put((char)local_190);
    std::ostream::flush();
    this_00 = (this->super_cmCPackGenerator).Logger;
    std::__cxx11::stringbuf::str();
    msg._M_p = local_1b0._M_dataplus._M_p;
    length = strlen(local_1b0._M_dataplus._M_p);
    cmCPackLog::Log(this_00,0x10,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cmCPackExternalGenerator.cxx"
                    ,0x1a,msg._M_p,length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
      operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
    std::ios_base::~ios_base(local_120);
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

int cmCPackExternalGenerator::InitializeInternal()
{
  this->SetOption("CPACK_EXTERNAL_KNOWN_VERSIONS", "1.0");

  if (!this->ReadListFile("Internal/CPack/CPackExternal.cmake")) {
    cmCPackLogger(cmCPackLog::LOG_ERROR,
                  "Error while executing CPackExternal.cmake" << std::endl);
    return 0;
  }

  std::string major = this->GetOption("CPACK_EXTERNAL_SELECTED_MAJOR");
  if (major == "1") {
    this->Generator = cm::make_unique<cmCPackExternalVersion1Generator>(this);
  }

  return this->Superclass::InitializeInternal();
}